

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

Boxed_Value
chaiscript::dispatch::detail::
call_func<std::unique_ptr<Unique_Ptr_Test_Class,std::default_delete<Unique_Ptr_Test_Class>>(*)(),std::unique_ptr<Unique_Ptr_Test_Class,std::default_delete<Unique_Ptr_Test_Class>>>
          (_func_unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_> *sig
          ,_func_unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_> **f,
          Function_Params *params,Type_Conversions_State *t_conversions)

{
  Unique_Ptr_Test_Class *in_RAX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pointer *__ptr;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar2;
  Boxed_Value BVar3;
  _Head_base<0UL,_Unique_Ptr_Test_Class_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (*(code *)params->m_begin)(&local_18);
  sVar2 = Boxed_Value::Object_Data::get<Unique_Ptr_Test_Class>
                    ((Object_Data *)sig,
                     (unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_>
                      *)&local_18,true);
  _Var1 = sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_18._M_head_impl != (Unique_Ptr_Test_Class *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Unique_Ptr_Test_Class[1])();
    _Var1._M_pi = extraout_RDX;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)sig;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value
      call_func(Ret (*sig)(Params...), const Callable &f, const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) {
        if constexpr (std::is_same_v<Ret, void>) {
          call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions);
          return Handle_Return<void>::handle();
        } else {
          return Handle_Return<Ret>::handle(call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions));
        }
      }